

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O2

void __thiscall r_exec::MkLowAct::MkLowAct(MkLowAct *this,Mem *m,Code *object)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Atom local_1c [4];
  Atom local_18 [4];
  Atom local_14 [4];
  
  LObject::LObject(&this->super_LObject,m);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Object_001d09c8;
  r_code::Atom::Marker((ushort)local_14,(uchar)Opcodes::MkLowAct);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_14);
  r_code::Atom::~Atom(local_14);
  r_code::Atom::RPointer((ushort)local_18);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_18);
  r_code::Atom::~Atom(local_18);
  r_code::Atom::Float(0.0);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_1c);
  r_code::Atom::~Atom(local_1c);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[8])(this,0,object);
  return;
}

Assistant:

MkLowAct::MkLowAct(r_code::Mem *m, Code *object): LObject(m)
{
    uint16_t write_index = 0;
    code(write_index++) = r_code::Atom::Marker(Opcodes::MkLowAct, 2);
    code(write_index++) = r_code::Atom::RPointer(0); // object.
    code(write_index++) = r_code::Atom::Float(0); // psln_thr.
    set_reference(0, object);
}